

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O1

HighsStatus __thiscall
Highs::getBasisTransposeSolve
          (Highs *this,double *Xrhs,double *solution_vector,HighsInt *solution_num_nz,
          HighsInt *solution_indices)

{
  int iVar1;
  HighsStatus HVar2;
  size_type sVar3;
  char *format;
  vector<double,_std::allocator<double>_> rhs;
  vector<double,_std::allocator<double>_> local_78;
  value_type_conflict1 local_58;
  string local_50;
  
  if (Xrhs == (double *)0x0) {
    format = "getBasisTransposeSolve: Xrhs is NULL\n";
  }
  else {
    if (solution_vector != (double *)0x0) {
      if ((this->ekk_instance_).status_.has_invert != false) {
        iVar1 = (this->model_).lp_.num_row_;
        local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_end_of_storage = (pointer)0x0;
        local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start = (pointer)0x0;
        local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_finish = (pointer)0x0;
        local_58 = 0.0;
        std::vector<double,_std::allocator<double>_>::_M_fill_assign
                  (&local_78,(long)iVar1,&local_58);
        if (0 < iVar1) {
          sVar3 = 0;
          do {
            local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[sVar3] = Xrhs[sVar3];
            sVar3 = sVar3 + 1;
          } while ((long)iVar1 != sVar3);
        }
        basisSolveInterface(this,&local_78,solution_vector,solution_num_nz,solution_indices,true);
        if (local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        return kOk;
      }
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,"getBasisTransposeSolve","");
      HVar2 = invertRequirementError(this,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p == &local_50.field_2) {
        return HVar2;
      }
      operator_delete(local_50._M_dataplus._M_p);
      return HVar2;
    }
    format = "getBasisTransposeSolve: solution_vector is NULL\n";
  }
  highsLogUser(&(this->options_).super_HighsOptionsStruct.log_options,kError,format);
  return kError;
}

Assistant:

HighsStatus Highs::getBasisTransposeSolve(const double* Xrhs,
                                          double* solution_vector,
                                          HighsInt* solution_num_nz,
                                          HighsInt* solution_indices) {
  if (Xrhs == NULL) {
    highsLogUser(options_.log_options, HighsLogType::kError,
                 "getBasisTransposeSolve: Xrhs is NULL\n");
    return HighsStatus::kError;
  }
  if (solution_vector == NULL) {
    highsLogUser(options_.log_options, HighsLogType::kError,
                 "getBasisTransposeSolve: solution_vector is NULL\n");
    return HighsStatus::kError;
  }
  // solution_indices can be NULL - it's the trigger that determines
  // whether they are identified or not
  if (!ekk_instance_.status_.has_invert)
    return invertRequirementError("getBasisTransposeSolve");
  HighsInt num_row = model_.lp_.num_row_;
  vector<double> rhs;
  rhs.assign(num_row, 0);
  for (HighsInt row = 0; row < num_row; row++) rhs[row] = Xrhs[row];
  basisSolveInterface(rhs, solution_vector, solution_num_nz, solution_indices,
                      true);
  return HighsStatus::kOk;
}